

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O2

int dBoxBox2(cbtVector3 *p1,cbtScalar *R1,cbtVector3 *side1,cbtVector3 *p2,cbtScalar *R2,
            cbtVector3 *side2,cbtVector3 *normal,cbtScalar *depth,int *return_code,int maxc,
            dContactGeom *param_11,int param_12,Result *output)

{
  undefined8 *puVar1;
  cbtScalar acVar3 [4];
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  long lVar33;
  cbtVector3 *pcVar34;
  cbtScalar *pcVar35;
  ulong uVar36;
  uint uVar37;
  cbtScalar *pcVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  int nr_1;
  uint uVar42;
  int i;
  uint uVar43;
  uint uVar44;
  cbtScalar *pcVar45;
  long lVar46;
  cbtScalar *pcVar47;
  int sign;
  int iVar48;
  cbtScalar *pcVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  bool bVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  cbtScalar cVar85;
  cbtScalar cVar86;
  cbtScalar cVar87;
  cbtScalar cVar88;
  cbtScalar cVar89;
  cbtScalar cVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar108;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar95 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 in_ZMM0 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined1 auVar109 [56];
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar120 [56];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined4 uVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  cbtVector3 cVar134;
  cbtVector3 cVar135;
  cbtScalar *local_2e8;
  cbtVector3 *local_2d0;
  uint local_2b8;
  uint local_288;
  cbtScalar rect [2];
  undefined1 local_268 [16];
  cbtScalar *local_248;
  cbtVector3 center;
  cbtVector3 posInWorld;
  undefined1 local_1e8 [16];
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined1 local_188 [16];
  cbtScalar local_178;
  cbtScalar cStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  cbtScalar dep [8];
  cbtVector3 nr;
  int iret [8];
  cbtScalar ret [16];
  undefined1 local_d8 [16];
  cbtScalar point [24];
  cbtVector3 ua;
  cbtVector3 local_40;
  undefined8 *puVar2;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar120 = in_ZMM1._8_56_;
  auVar109 = in_ZMM0._8_56_;
  cVar134 = operator-(p2,p1);
  auVar113._0_8_ = cVar134.m_floats._8_8_;
  auVar113._8_56_ = auVar120;
  auVar114._0_8_ = cVar134.m_floats._0_8_;
  auVar114._8_56_ = auVar109;
  auVar73 = auVar114._0_16_;
  local_188 = vmovshdup_avx(auVar73);
  fVar124 = local_188._0_4_;
  auVar72 = auVar113._0_16_;
  pcVar45 = R1 + 1;
  pcVar49 = R1 + 2;
  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * R1[4])),auVar73,ZEXT416((uint)*R1));
  auVar80 = vfmadd231ss_fma(auVar80,auVar72,ZEXT416((uint)R1[8]));
  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * R1[5])),auVar73,ZEXT416((uint)R1[1]));
  auVar83 = vfmadd231ss_fma(auVar83,auVar72,ZEXT416((uint)R1[9]));
  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * R1[6])),auVar73,ZEXT416((uint)R1[2]));
  auVar79 = vfmadd231ss_fma(auVar79,auVar72,ZEXT416((uint)R1[10]));
  auVar110._0_4_ = (float)*(undefined8 *)side1->m_floats * 0.5;
  auVar110._4_4_ = (float)((ulong)*(undefined8 *)side1->m_floats >> 0x20) * 0.5;
  auVar110._8_8_ = 0;
  local_198 = vmovlps_avx(auVar110);
  fVar124 = side1->m_floats[2] * 0.5;
  auVar93._0_4_ = (float)*(undefined8 *)side2->m_floats * 0.5;
  auVar93._4_4_ = (float)((ulong)*(undefined8 *)side2->m_floats >> 0x20) * 0.5;
  auVar93._8_8_ = 0;
  local_1a8 = vmovlps_avx(auVar93);
  fVar92 = side2->m_floats[2] * 0.5;
  local_1a0 = fVar92;
  local_190 = fVar124;
  cVar85 = dDOT44(R1,R2);
  pcVar35 = R2 + 1;
  cVar86 = dDOT44(R1,pcVar35);
  pcVar47 = R2 + 2;
  local_178 = dDOT44(R1,pcVar47);
  cStack_174 = (cbtScalar)extraout_XMM0_Db_01;
  uStack_170 = extraout_XMM0_Dc_01;
  uStack_16c = extraout_XMM0_Dd_01;
  local_268._0_4_ = dDOT44(pcVar45,R2);
  local_268._4_4_ = extraout_XMM0_Db_02;
  local_268._8_4_ = extraout_XMM0_Dc_02;
  local_268._12_4_ = extraout_XMM0_Dd_02;
  cVar87 = dDOT44(pcVar45,pcVar35);
  cVar88 = dDOT44(pcVar45,pcVar47);
  cVar89 = dDOT44(pcVar49,R2);
  cVar90 = dDOT44(pcVar49,pcVar35);
  auVar98._0_4_ = dDOT44(pcVar49,pcVar47);
  auVar98._4_60_ = extraout_var;
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  auVar81._4_4_ = extraout_XMM0_Db;
  auVar81._0_4_ = cVar85;
  auVar81._8_4_ = extraout_XMM0_Dc;
  auVar81._12_4_ = extraout_XMM0_Dd;
  auVar82._4_4_ = extraout_XMM0_Db_00;
  auVar82._0_4_ = cVar86;
  auVar82._8_4_ = extraout_XMM0_Dc_00;
  auVar82._12_4_ = extraout_XMM0_Dd_00;
  auVar30._4_4_ = cStack_174;
  auVar30._0_4_ = local_178;
  auVar30._8_4_ = uStack_170;
  auVar30._12_4_ = uStack_16c;
  auVar55 = vmovshdup_avx512vl(auVar93);
  auVar56 = vandps_avx512vl(auVar81,auVar77);
  auVar57 = vandps_avx512vl(auVar82,auVar77);
  auVar58 = vandps_avx512vl(auVar30,auVar77);
  auVar59 = vandps_avx512vl(auVar80,auVar77);
  auVar60 = vfmadd213ss_avx512f(auVar56,auVar93,auVar110);
  auVar60 = vfmadd231ss_fma(auVar60,auVar55,auVar57);
  auVar60 = vfmadd231ss_avx512f(auVar60,ZEXT416((uint)fVar92),auVar58);
  fVar91 = auVar59._0_4_ - auVar60._0_4_;
  if (0.0 < fVar91) {
    return 0;
  }
  auVar78 = SUB6416(ZEXT464(0xff7fffff),0);
  auVar59._4_4_ = extraout_XMM0_Db_03;
  auVar59._0_4_ = cVar87;
  auVar59._8_4_ = extraout_XMM0_Dc_03;
  auVar59._12_4_ = extraout_XMM0_Dd_03;
  auVar60._4_4_ = extraout_XMM0_Db_04;
  auVar60._0_4_ = cVar88;
  auVar60._8_4_ = extraout_XMM0_Dc_04;
  auVar60._12_4_ = extraout_XMM0_Dd_04;
  auVar61 = vandps_avx512vl(local_268,auVar77);
  auVar62 = vandps_avx512vl(auVar59,auVar77);
  auVar63 = vandps_avx512vl(auVar60,auVar77);
  if (fVar91 <= -3.4028235e+38) {
    pcVar38 = (cbtScalar *)0x0;
  }
  else {
    vucomiss_avx512f(auVar80);
    auVar78 = ZEXT416((uint)fVar91);
    pcVar38 = R1;
  }
  uVar44 = (uint)(fVar91 > -3.4028235e+38);
  auVar64 = vmovshdup_avx512vl(auVar110);
  auVar76._4_4_ = extraout_XMM0_Db_06;
  auVar76._0_4_ = cVar90;
  auVar76._8_4_ = extraout_XMM0_Dc_06;
  auVar76._12_4_ = extraout_XMM0_Dd_06;
  auVar74._4_4_ = extraout_XMM0_Db_05;
  auVar74._0_4_ = cVar89;
  auVar74._8_4_ = extraout_XMM0_Dc_05;
  auVar74._12_4_ = extraout_XMM0_Dd_05;
  auVar65 = vfmadd213ss_avx512f(auVar61,auVar93,auVar64);
  auVar67._8_4_ = 0x7fffffff;
  auVar67._0_8_ = 0x7fffffff7fffffff;
  auVar67._12_4_ = 0x7fffffff;
  auVar66 = vandps_avx512vl(auVar83,auVar67);
  auVar67 = vfmadd231ss_fma(auVar65,auVar55,auVar62);
  auVar67 = vfmadd231ss_avx512f(auVar67,ZEXT416((uint)fVar92),auVar63);
  fVar91 = auVar66._0_4_ - auVar67._0_4_;
  if (0.0 < fVar91) {
    return 0;
  }
  auVar67 = vandps_avx512vl(auVar74,auVar77);
  auVar65 = vandps_avx512vl(auVar76,auVar77);
  auVar66 = auVar98._0_16_;
  auVar77 = vandps_avx(auVar77,auVar66);
  if (auVar78._0_4_ < fVar91) {
    vucomiss_avx512f(auVar83);
    uVar44 = 2;
    auVar78 = ZEXT416((uint)fVar91);
    pcVar38 = pcVar45;
  }
  auVar68 = vfmadd213ss_avx512f(auVar67,auVar93,ZEXT416((uint)fVar124));
  auVar70._8_4_ = 0x7fffffff;
  auVar70._0_8_ = 0x7fffffff7fffffff;
  auVar70._12_4_ = 0x7fffffff;
  auVar69 = vandps_avx512vl(auVar79,auVar70);
  auVar70 = vfmadd231ss_fma(auVar68,auVar55,auVar65);
  auVar68 = ZEXT416((uint)fVar92);
  auVar70 = vfmadd231ss_avx512f(auVar70,auVar68,auVar77);
  fVar91 = auVar69._0_4_ - auVar70._0_4_;
  if (0.0 < fVar91) {
    return 0;
  }
  if (auVar78._0_4_ < fVar91) {
    uVar44 = 3;
    vucomiss_avx512f(auVar79);
    auVar78 = ZEXT416((uint)fVar91);
    pcVar38 = pcVar49;
  }
  fVar108 = auVar64._0_4_;
  auVar70 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * fVar108)),auVar110,auVar56);
  auVar70 = vfmadd231ss_fma(auVar70,auVar67,ZEXT416((uint)fVar124));
  auVar69 = vfmadd231ss_fma(ZEXT416((uint)((float)local_188._0_4_ * R2[4])),auVar73,
                            ZEXT416((uint)*R2));
  auVar69 = vfmadd231ss_fma(auVar69,auVar72,ZEXT416((uint)R2[8]));
  auVar71._8_4_ = 0x7fffffff;
  auVar71._0_8_ = 0x7fffffff7fffffff;
  auVar71._12_4_ = 0x7fffffff;
  auVar71 = vandps_avx512vl(auVar69,auVar71);
  auVar70 = vaddss_avx512f(auVar93,auVar70);
  fVar91 = auVar71._0_4_ - auVar70._0_4_;
  if (0.0 < fVar91) {
    return 0;
  }
  bVar5 = auVar78._0_4_ < fVar91;
  if (bVar5) {
    uVar44 = 4;
    auVar78 = ZEXT416((uint)fVar91);
    pcVar38 = R2;
  }
  bVar5 = bVar5 && auVar69._0_4_ < 0.0;
  auVar70 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar108 * auVar62._0_4_)),auVar110,auVar57);
  auVar70 = vfmadd231ss_fma(auVar70,auVar65,ZEXT416((uint)fVar124));
  auVar69 = vfmadd231ss_fma(ZEXT416((uint)((float)local_188._0_4_ * R2[5])),auVar73,
                            ZEXT416((uint)R2[1]));
  auVar69 = vfmadd231ss_fma(auVar69,auVar72,ZEXT416((uint)R2[9]));
  auVar133._8_4_ = 0x7fffffff;
  auVar133._0_8_ = 0x7fffffff7fffffff;
  auVar133._12_4_ = 0x7fffffff;
  auVar71 = vandps_avx512vl(auVar69,auVar133);
  fVar91 = auVar71._0_4_ - (auVar70._0_4_ + auVar55._0_4_);
  if (0.0 < fVar91) {
    return 0;
  }
  if (auVar78._0_4_ < fVar91) {
    bVar5 = auVar69._0_4_ < 0.0;
    uVar44 = 5;
    auVar78 = ZEXT416((uint)fVar91);
    pcVar38 = pcVar35;
  }
  auVar73 = vfmadd231ss_fma(ZEXT416((uint)((float)local_188._0_4_ * R2[6])),auVar73,
                            ZEXT416((uint)R2[2]));
  auVar73 = vfmadd132ss_fma(auVar72,auVar73,ZEXT416((uint)R2[10]));
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  auVar70 = vandps_avx512vl(auVar73,auVar72);
  auVar72 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar63._0_4_ * fVar108)),auVar110,auVar58);
  auVar72 = vfmadd231ss_fma(auVar72,auVar77,ZEXT416((uint)fVar124));
  auVar72 = vaddss_avx512f(auVar68,auVar72);
  fVar91 = auVar70._0_4_ - auVar72._0_4_;
  if (0.0 < fVar91) {
    return 0;
  }
  fVar125 = auVar78._0_4_;
  bVar54 = fVar91 == fVar125;
  bVar53 = fVar91 < fVar125;
  if (fVar125 < fVar91) {
    fVar125 = auVar73._0_4_;
    bVar54 = fVar125 == 0.0;
    bVar53 = 0.0 < fVar125;
    bVar5 = fVar125 < 0.0;
    uVar44 = 6;
    auVar78 = ZEXT416((uint)fVar91);
    pcVar38 = pcVar47;
  }
  auVar73 = vmulss_avx512f(auVar74,auVar83);
  auVar73 = vfmsub231ss_avx512f(auVar73,auVar79,local_268);
  auVar72 = vaddss_avx512f(auVar61,ZEXT416(0x3727c5ac));
  auVar61 = vmulss_avx512f(auVar72,ZEXT416((uint)fVar124));
  auVar70 = vaddss_avx512f(auVar57,ZEXT416(0x3727c5ac));
  auVar69 = ZEXT416(0x3727c5ac);
  auVar67 = vaddss_avx512f(auVar67,auVar69);
  auVar58 = vaddss_avx512f(auVar58,auVar69);
  auVar57._8_4_ = 0x7fffffff;
  auVar57._0_8_ = 0x7fffffff7fffffff;
  auVar57._12_4_ = 0x7fffffff;
  auVar57 = vandps_avx512vl(auVar73,auVar57);
  auVar61 = vfmadd231ss_avx512f(auVar61,auVar64,auVar67);
  auVar61 = vfmadd231ss_avx512f(auVar61,auVar55,auVar58);
  auVar61 = vfmadd231ss_avx512f(auVar61,auVar68,auVar70);
  vsubss_avx512f(auVar57,auVar61);
  auVar57 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    return 0;
  }
  auVar62 = vaddss_avx512f(auVar62,auVar69);
  auVar65 = vaddss_avx512f(auVar65,auVar69);
  auVar61._8_4_ = 0x80000000;
  auVar61._0_8_ = 0x8000000080000000;
  auVar61._12_4_ = 0x80000000;
  auVar69 = vxorps_avx512vl(auVar83,auVar61);
  auVar133 = ZEXT416(0x3727c5ac);
  auVar71 = vaddss_avx512f(auVar56,auVar133);
  uVar37 = auVar65._0_4_;
  auVar65 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar74 = vfmadd213ss_avx512f(auVar74,auVar74,ZEXT816(0) << 0x20);
  auVar56 = vfmadd213ss_avx512f(local_268,local_268,auVar74);
  vsqrtss_avx512f(auVar56,auVar56);
  auVar56 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar61 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    auVar57 = vdivss_avx512f(auVar57,auVar61);
    vmulss_avx512f(auVar57,ZEXT416(0x3f866666));
    vucomiss_avx512f(auVar78);
    if (!bVar53 && !bVar54) {
      auVar78._4_4_ = extraout_XMM0_Db_05;
      auVar78._0_4_ = cVar89;
      auVar78._8_4_ = extraout_XMM0_Dc_05;
      auVar78._12_4_ = extraout_XMM0_Dd_05;
      auVar75 = vbroadcastss_avx512vl(auVar61);
      auVar76 = vxorps_avx512vl(auVar76,auVar76);
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      auVar56 = vxorps_avx512vl(auVar78,auVar56);
      auVar65 = vdivss_avx512f(auVar76,auVar61);
      vucomiss_avx512f(auVar73);
      auVar56 = vinsertps_avx(auVar56,ZEXT416((uint)local_268._0_4_),0x10);
      bVar5 = false;
      auVar56 = vdivps_avx(auVar56,auVar75);
      uVar44 = 7;
      bVar53 = false;
      pcVar38 = (cbtScalar *)0x0;
      bVar54 = true;
      auVar78 = auVar57;
    }
  }
  auVar57 = vmulss_avx512f(auVar62,ZEXT416((uint)fVar124));
  auVar73 = vmulss_avx512f(auVar76,auVar69);
  local_288 = auVar79._0_4_;
  auVar61 = vfmadd231ss_avx512f(auVar73,auVar59,ZEXT416(local_288));
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar73 = vandps_avx512vl(auVar61,auVar73);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar64,ZEXT416(uVar37));
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar93,auVar58);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar68,auVar71);
  vsubss_avx512f(auVar73,auVar57);
  auVar57 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    return 0;
  }
  auVar63 = vaddss_avx512f(auVar63,auVar133);
  auVar77 = vaddss_avx512f(auVar77,auVar133);
  auVar73 = vxorps_avx512vl(auVar133,auVar133);
  auVar76 = vfmadd231ss_avx512f(auVar73,auVar76,auVar76);
  auVar73 = vfmadd213ss_avx512f(auVar59,auVar59,auVar76);
  vsqrtss_avx512f(auVar73,auVar73);
  auVar73 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    auVar68 = vdivss_avx512f(auVar57,auVar73);
    vmulss_avx512f(auVar68,ZEXT416(0x3f866666));
    auVar57 = vucomiss_avx512f(auVar78);
    if (!bVar53 && !bVar54) {
      auVar26._4_4_ = extraout_XMM0_Db_06;
      auVar26._0_4_ = cVar90;
      auVar26._8_4_ = extraout_XMM0_Dc_06;
      auVar26._12_4_ = extraout_XMM0_Dd_06;
      auVar78 = vbroadcastss_avx512vl(auVar73);
      auVar56 = vxorps_avx512vl(auVar57,auVar57);
      auVar75._8_4_ = 0x80000000;
      auVar75._0_8_ = 0x8000000080000000;
      auVar75._12_4_ = 0x80000000;
      auVar57 = vxorps_avx512vl(auVar26,auVar75);
      auVar65 = vdivss_avx512f(auVar56,auVar73);
      vucomiss_avx512f(auVar61);
      bVar5 = false;
      auVar56 = vinsertps_avx512f(auVar57,auVar59,0x10);
      auVar56 = vdivps_avx(auVar56,auVar78);
      uVar44 = 8;
      bVar53 = false;
      pcVar38 = (cbtScalar *)0x0;
      bVar54 = true;
      auVar78 = auVar68;
    }
  }
  auVar57 = vmulss_avx512f(auVar63,ZEXT416((uint)fVar124));
  auVar73 = vmulss_avx512f(auVar66,auVar69);
  auVar73 = vfmadd231ss_avx512f(auVar73,auVar60,ZEXT416(local_288));
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  auVar61 = vandps_avx512vl(auVar73,auVar68);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar64,auVar77);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar93,auVar70);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar55,auVar71);
  vsubss_avx512f(auVar61,auVar57);
  auVar57 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    return 0;
  }
  auVar61 = vxorps_avx512vl(auVar61,auVar61);
  uVar43 = auVar77._0_4_;
  auVar61 = vfmadd231ss_avx512f(auVar61,auVar66,auVar66);
  auVar77 = vfmadd213ss_avx512f(auVar60,auVar60,auVar61);
  vsqrtss_avx512f(auVar77,auVar77);
  auVar77 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    auVar64 = vdivss_avx512f(auVar57,auVar77);
    vmulss_avx512f(auVar64,ZEXT416(0x3f866666));
    auVar57 = vucomiss_avx512f(auVar78);
    if (!bVar53 && !bVar54) {
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar56 = vxorps_avx512vl(auVar66,auVar69);
      auVar78 = vbroadcastss_avx512vl(auVar77);
      auVar57 = vxorps_avx512vl(auVar57,auVar57);
      auVar65 = vdivss_avx512f(auVar57,auVar77);
      vucomiss_avx512f(auVar73);
      bVar5 = false;
      auVar56 = vinsertps_avx512f(auVar56,auVar60,0x10);
      auVar56 = vdivps_avx(auVar56,auVar78);
      uVar44 = 9;
      bVar53 = false;
      pcVar38 = (cbtScalar *)0x0;
      bVar54 = true;
      auVar78 = auVar64;
    }
  }
  auVar57 = vmulss_avx512f(auVar71,ZEXT416((uint)fVar124));
  auVar73 = vmulss_avx512f(auVar81,auVar79);
  auVar73 = vfmsub231ss_avx512f(auVar73,auVar80,ZEXT416((uint)cVar89));
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar110,auVar67);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  auVar77 = vandps_avx512vl(auVar73,auVar64);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar55,auVar63);
  auVar64 = ZEXT416((uint)fVar92);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar64,auVar62);
  vsubss_avx512f(auVar77,auVar57);
  auVar57 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    return 0;
  }
  auVar77 = vfmadd231ss_avx512f(auVar74,auVar81,auVar81);
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar74 = vxorps_avx512vl(auVar79,auVar6);
  vsqrtss_avx512f(auVar77,auVar77);
  auVar79 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    auVar57 = vdivss_avx512f(auVar57,auVar79);
    vmulss_avx512f(auVar57,ZEXT416(0x3f866666));
    vucomiss_avx512f(auVar78);
    if (!bVar53 && !bVar54) {
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar56 = vxorps_avx512vl(auVar81,auVar7);
      auVar28._4_4_ = extraout_XMM0_Db_05;
      auVar28._0_4_ = cVar89;
      auVar28._8_4_ = extraout_XMM0_Dc_05;
      auVar28._12_4_ = extraout_XMM0_Dd_05;
      auVar77 = vbroadcastss_avx512vl(auVar79);
      auVar56 = vinsertps_avx(auVar66,auVar56,0x1d);
      auVar65 = vdivss_avx512f(auVar28,auVar79);
      auVar56 = vdivps_avx(auVar56,auVar77);
      vucomiss_avx512f(auVar73);
      bVar5 = false;
      uVar44 = 10;
      bVar53 = false;
      pcVar38 = (cbtScalar *)0x0;
      bVar54 = true;
      auVar78 = auVar57;
    }
  }
  auVar57 = vmulss_avx512f(auVar70,ZEXT416((uint)fVar124));
  auVar27._4_4_ = extraout_XMM0_Db_06;
  auVar27._0_4_ = cVar90;
  auVar27._8_4_ = extraout_XMM0_Dc_06;
  auVar27._12_4_ = extraout_XMM0_Dd_06;
  auVar79 = vmulss_avx512f(auVar82,auVar74);
  auVar73 = vfmadd231ss_avx512f(auVar79,auVar80,auVar27);
  auVar79._8_4_ = 0x7fffffff;
  auVar79._0_8_ = 0x7fffffff7fffffff;
  auVar79._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx512vl(auVar73,auVar79);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar110,ZEXT416(uVar37));
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar93,auVar63);
  auVar57 = vfmadd231ss_avx512f(auVar57,auVar64,auVar72);
  vsubss_avx512f(auVar79,auVar57);
  auVar79 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    return 0;
  }
  auVar57 = vfmadd231ss_avx512f(auVar76,auVar82,auVar82);
  vsqrtss_avx512f(auVar57,auVar57);
  auVar57 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    auVar79 = vdivss_avx512f(auVar79,auVar57);
    vmulss_avx512f(auVar79,ZEXT416(0x3f866666));
    vucomiss_avx512f(auVar78);
    if (!bVar53 && !bVar54) {
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar56 = vxorps_avx512vl(auVar82,auVar8);
      auVar77 = vbroadcastss_avx512vl(auVar57);
      auVar65 = vdivss_avx512f(auVar27,auVar57);
      auVar56 = vinsertps_avx(auVar66,auVar56,0x1d);
      auVar56 = vdivps_avx(auVar56,auVar77);
      bVar5 = auVar73._0_4_ < 0.0;
      uVar44 = 0xb;
      bVar53 = false;
      pcVar38 = (cbtScalar *)0x0;
      bVar54 = true;
      auVar78 = auVar79;
    }
  }
  auVar79 = vmulss_avx512f(auVar30,auVar74);
  auVar57 = vfmadd231ss_avx512f(auVar79,auVar80,auVar66);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar73 = vandps_avx512vl(auVar57,auVar9);
  auVar79 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * fVar124)),auVar110,ZEXT416(uVar43));
  auVar79 = vfmadd231ss_avx512f(auVar79,auVar93,auVar62);
  auVar79 = vfmadd231ss_fma(auVar79,auVar55,auVar72);
  vsubss_avx512f(auVar73,auVar79);
  auVar79 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    return 0;
  }
  auVar73 = vfmadd231ss_avx512f(auVar61,auVar30,auVar30);
  vsqrtss_avx512f(auVar73,auVar73);
  auVar73 = vucomiss_avx512f(ZEXT416(0x34000000));
  if (!bVar53 && !bVar54) {
    auVar79 = vdivss_avx512f(auVar79,auVar73);
    vmulss_avx512f(auVar79,ZEXT416(0x3f866666));
    vucomiss_avx512f(auVar78);
    if (!bVar53 && !bVar54) {
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar56 = vxorps_avx512vl(auVar30,auVar10);
      auVar65 = vdivss_avx512f(auVar66,auVar73);
      auVar56 = vinsertps_avx(auVar66,auVar56,0x1d);
      auVar73 = vbroadcastss_avx512vl(auVar73);
      auVar56 = vdivps_avx(auVar56,auVar73);
      bVar5 = auVar57._0_4_ < 0.0;
      uVar44 = 0xc;
      pcVar38 = (cbtScalar *)0x0;
      auVar78 = auVar79;
    }
  }
  auVar79 = vmulss_avx512f(local_268,auVar80);
  auVar57 = vfmadd213ss_avx512f(auVar72,auVar110,ZEXT416((uint)(fVar108 * auVar71._0_4_)));
  auVar73 = vfmsub231ss_avx512f(auVar79,auVar83,auVar81);
  auVar66._8_4_ = 0x7fffffff;
  auVar66._0_8_ = 0x7fffffff7fffffff;
  auVar66._12_4_ = 0x7fffffff;
  auVar72 = vandps_avx512vl(auVar73,auVar66);
  auVar79 = vfmadd231ss_fma(auVar57,auVar55,ZEXT416(uVar43));
  auVar79 = vfmadd231ss_avx512f(auVar79,auVar64,ZEXT416(uVar37));
  fVar124 = auVar72._0_4_ - auVar79._0_4_;
  if (1.1920929e-07 < fVar124) {
    return 0;
  }
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  auVar80 = vxorps_avx512vl(auVar80,auVar11);
  auVar79 = vmulss_avx512f(auVar81,auVar81);
  auVar79 = vfmadd213ss_avx512f(local_268,local_268,auVar79);
  auVar79 = vsqrtss_avx512f(auVar79,auVar79);
  fVar92 = auVar79._0_4_;
  if (1.1920929e-07 < fVar92) {
    auVar132._0_4_ = fVar124 / fVar92;
    auVar132._4_12_ = SUB6012((undefined1  [60])0x0,0);
    vmulss_avx512f(auVar132,ZEXT416(0x3f866666));
    vucomiss_avx512f(auVar78);
    if (1.1920929e-07 < fVar92) {
      auVar129._4_4_ = fVar92;
      auVar129._0_4_ = fVar92;
      auVar129._8_4_ = fVar92;
      auVar129._12_4_ = fVar92;
      auVar12._8_4_ = 0x80000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar12._12_4_ = 0x80000000;
      auVar79 = vxorps_avx512vl(local_268,auVar12);
      auVar65._0_4_ = auVar79._0_4_ / fVar92;
      auVar65._4_12_ = auVar79._4_12_;
      auVar56 = vdivps_avx(ZEXT416((uint)cVar85),auVar129);
      bVar5 = auVar73._0_4_ < 0.0;
      uVar44 = 0xd;
      pcVar38 = (cbtScalar *)0x0;
      auVar78 = auVar132;
    }
  }
  auVar79 = vmulss_avx512f(auVar59,auVar80);
  auVar81 = vfmadd213ss_avx512f(auVar62,auVar110,ZEXT416((uint)(auVar70._0_4_ * fVar108)));
  auVar79 = vfmadd231ss_avx512f(auVar79,auVar83,auVar82);
  auVar62._8_4_ = 0x7fffffff;
  auVar62._0_8_ = 0x7fffffff7fffffff;
  auVar62._12_4_ = 0x7fffffff;
  auVar57 = vandps_avx512vl(auVar79,auVar62);
  auVar81 = vfmadd213ss_avx512f(ZEXT416(uVar43),auVar93,auVar81);
  auVar81 = vfmadd213ss_avx512f(auVar64,auVar67,auVar81);
  auVar81 = vsubss_avx512f(auVar57,auVar81);
  if (1.1920929e-07 < auVar81._0_4_) {
    return 0;
  }
  auVar82 = vmulss_avx512f(auVar82,auVar82);
  auVar82 = vfmadd213ss_avx512f(auVar59,auVar59,auVar82);
  auVar82 = vsqrtss_avx(auVar82,auVar82);
  fVar124 = auVar82._0_4_;
  if ((1.1920929e-07 < fVar124) &&
     (auVar131._0_4_ = auVar81._0_4_ / fVar124, auVar131._4_12_ = auVar81._4_12_,
     auVar78._0_4_ < auVar131._0_4_ * 1.05)) {
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar82 = vxorps_avx512vl(auVar59,auVar13);
    auVar130._4_4_ = fVar124;
    auVar130._0_4_ = fVar124;
    auVar130._8_4_ = fVar124;
    auVar130._12_4_ = fVar124;
    auVar65._0_4_ = auVar82._0_4_ / fVar124;
    auVar65._4_12_ = auVar82._4_12_;
    auVar56 = vdivps_avx(ZEXT416((uint)cVar86),auVar130);
    bVar5 = auVar79._0_4_ < 0.0;
    uVar44 = 0xe;
    pcVar38 = (cbtScalar *)0x0;
    auVar78 = auVar131;
  }
  auVar80 = vmulss_avx512f(auVar60,auVar80);
  auVar79 = vfmadd213ss_avx512f(auVar63,auVar110,ZEXT416((uint)(fVar108 * auVar58._0_4_)));
  auVar83 = vfmadd213ss_avx512f(auVar83,auVar30,auVar80);
  auVar79 = vfmadd213ss_avx512f(ZEXT416(uVar37),auVar93,auVar79);
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar82 = vandps_avx512vl(auVar83,auVar80);
  auVar80 = vfmadd213ss_fma(auVar67,auVar55,auVar79);
  fVar124 = auVar82._0_4_ - auVar80._0_4_;
  if (1.1920929e-07 < fVar124) {
    return 0;
  }
  auVar80 = vmulss_avx512f(auVar30,auVar30);
  auVar80 = vfmadd213ss_avx512f(auVar60,auVar60,auVar80);
  auVar80 = vsqrtss_avx(auVar80,auVar80);
  auVar55._0_4_ = auVar80._0_4_;
  if ((auVar55._0_4_ <= 1.1920929e-07) ||
     (auVar58._0_4_ = fVar124 / auVar55._0_4_, auVar58._4_12_ = SUB6012((undefined1  [60])0x0,0),
     auVar58._0_4_ * 1.05 <= auVar78._0_4_)) {
    if (uVar44 == 0) {
      return 0;
    }
    if (pcVar38 != (cbtScalar *)0x0) {
      cVar85 = *pcVar38;
      normal->m_floats[0] = cVar85;
      auVar114 = ZEXT464((uint)pcVar38[4]);
      normal->m_floats[1] = pcVar38[4];
      cVar86 = pcVar38[8];
      goto LAB_00df35f8;
    }
  }
  else {
    auVar63._8_4_ = 0x80000000;
    auVar63._0_8_ = 0x8000000080000000;
    auVar63._12_4_ = 0x80000000;
    auVar80 = vxorps_avx512vl(auVar60,auVar63);
    auVar65._0_4_ = auVar80._0_4_ / auVar55._0_4_;
    auVar65._4_12_ = auVar80._4_12_;
    auVar55._4_4_ = auVar55._0_4_;
    auVar55._8_4_ = auVar55._0_4_;
    auVar55._12_4_ = auVar55._0_4_;
    auVar56 = vdivps_avx(ZEXT416((uint)local_178),auVar55);
    bVar5 = auVar83._0_4_ < 0.0;
    uVar44 = 0xf;
    auVar78 = auVar58;
  }
  fVar124 = auVar56._0_4_;
  auVar80 = vmovshdup_avx(auVar56);
  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * R1[1])),auVar65,ZEXT416((uint)*R1));
  auVar83 = vfmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)R1[2]));
  cVar85 = auVar83._0_4_;
  normal->m_floats[0] = cVar85;
  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * R1[5])),auVar65,ZEXT416((uint)R1[4]));
  auVar83 = vfmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)R1[6]));
  auVar114 = ZEXT1664(auVar83);
  normal->m_floats[1] = auVar83._0_4_;
  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * R1[9])),auVar65,ZEXT416((uint)R1[8]));
  auVar80 = vfmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)R1[10]));
  cVar86 = auVar80._0_4_;
LAB_00df35f8:
  normal->m_floats[2] = cVar86;
  if (bVar5) {
    normal->m_floats[0] = -cVar85;
    normal->m_floats[1] = -auVar114._0_4_;
    normal->m_floats[2] = -cVar86;
  }
  auVar83._8_4_ = 0x80000000;
  auVar83._0_8_ = 0x8000000080000000;
  auVar83._12_4_ = 0x80000000;
  auVar80 = vxorps_avx512vl(auVar78,auVar83);
  *depth = auVar80._0_4_;
  if (uVar44 < 7) {
    local_1b8 = ZEXT416((uint)normal->m_floats[0]);
    if (uVar44 < 4) {
      local_178 = normal->m_floats[1];
      cStack_174 = normal->m_floats[2];
      uStack_170 = 0;
      uStack_16c = 0;
      puVar2 = &local_198;
      puVar1 = &local_1a8;
      pcVar34 = p2;
      pcVar45 = R1;
      local_2d0 = p1;
      local_248 = R2;
    }
    else {
      puVar1 = &local_198;
      puVar2 = &local_1a8;
      local_178 = -normal->m_floats[1];
      cStack_174 = -normal->m_floats[2];
      uStack_16c = 0x80000000;
      uStack_170 = 0x80000000;
      local_1b8._4_4_ = 0x80000000;
      local_1b8._0_4_ = -normal->m_floats[0];
      local_1b8._8_4_ = 0x80000000;
      local_1b8._12_4_ = 0x80000000;
      pcVar34 = p1;
      pcVar45 = R2;
      local_2d0 = p2;
      local_248 = R1;
    }
    auVar31._4_4_ = cStack_174;
    auVar31._0_4_ = local_178;
    auVar31._8_4_ = uStack_170;
    auVar31._12_4_ = uStack_16c;
    auVar114 = ZEXT1664(local_1b8);
    auVar111._8_8_ = 0;
    auVar111._0_8_ = *(ulong *)local_248;
    uVar127 = local_1b8._0_4_;
    auVar126._4_4_ = uVar127;
    auVar126._0_4_ = uVar127;
    auVar126._8_4_ = uVar127;
    auVar126._12_4_ = uVar127;
    auVar94._0_4_ = local_178 * (float)*(ulong *)(local_248 + 4);
    auVar94._4_4_ = local_178 * (float)(*(ulong *)(local_248 + 4) >> 0x20);
    auVar94._8_4_ = local_178 * 0.0;
    auVar94._12_4_ = local_178 * 0.0;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = *(ulong *)(local_248 + 8);
    auVar80 = vfmadd213ps_fma(auVar126,auVar111,auVar94);
    auVar79 = vmovshdup_avx(auVar31);
    auVar80 = vfmadd231ps_fma(auVar80,auVar79,auVar121);
    auVar122._8_4_ = 0x7fffffff;
    auVar122._0_8_ = 0x7fffffff7fffffff;
    auVar122._12_4_ = 0x7fffffff;
    uVar4 = vmovlps_avx(auVar80);
    nr.m_floats[0] = (cbtScalar)uVar4;
    nr.m_floats[1] = SUB84(uVar4,4);
    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(local_178 * local_248[6])),local_1b8,
                              ZEXT416((uint)local_248[2]));
    auVar83 = vfmadd231ss_fma(auVar83,auVar79,ZEXT416((uint)local_248[10]));
    auVar80 = vandps_avx(auVar80,auVar122);
    nr.m_floats[2] = auVar83._0_4_;
    auVar83 = vandps_avx(auVar83,auVar122);
    auVar60 = vshufps_avx(auVar80,auVar80,0xf5);
    fVar92 = auVar80._0_4_;
    fVar124 = auVar83._0_4_;
    if (auVar60._0_4_ <= fVar92) {
      bVar5 = fVar124 < fVar92;
      uVar39 = (ulong)((uint)(fVar92 <= fVar124) * 2);
      local_2b8 = (uint)bVar5;
    }
    else {
      bVar5 = fVar124 < auVar60._0_4_;
      uVar39 = 2 - (ulong)bVar5;
      local_2b8 = 0;
    }
    uVar36 = (ulong)(uint)((int)uVar39 * 4);
    auVar80 = ZEXT416(*(uint *)((long)puVar1 + uVar36));
    if (0.0 <= *(float *)((long)nr.m_floats + uVar36)) {
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar80 = vxorps_avx512vl(auVar80,auVar25);
      for (lVar32 = 0; lVar32 != 0xc; lVar32 = lVar32 + 4) {
        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(*(float *)((long)pcVar34->m_floats + lVar32) -
                                                *(float *)((long)local_2d0->m_floats + lVar32))),
                                  auVar80,ZEXT416((uint)local_248[uVar39 + lVar32]));
        *(int *)((long)center.m_floats + lVar32) = auVar83._0_4_;
      }
    }
    else {
      for (lVar32 = 0; lVar32 != 0xc; lVar32 = lVar32 + 4) {
        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(*(float *)((long)pcVar34->m_floats + lVar32) -
                                                *(float *)((long)local_2d0->m_floats + lVar32))),
                                  auVar80,ZEXT416((uint)local_248[uVar39 + lVar32]));
        *(int *)((long)center.m_floats + lVar32) = auVar83._0_4_;
      }
    }
    iVar48 = 2;
    uVar37 = (-(uint)(uVar44 < 4) | 0xfffffffc) + uVar44;
    if (uVar37 == 0) {
      iVar50 = 1;
    }
    else {
      if (uVar37 != 1) {
        iVar48 = 1;
      }
      iVar50 = 0;
    }
    uVar43 = 4;
    uVar40 = (ulong)(uint)(iVar50 << 2);
    uVar36 = (ulong)(uint)(iVar48 << 2);
    auVar80 = vinsertps_avx(ZEXT416(*(uint *)((long)pcVar45 + uVar40 + 0x10)),
                            ZEXT416(*(uint *)((long)pcVar45 + uVar36 + 0x10)),0x10);
    auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pcVar45 + uVar40)),
                            ZEXT416(*(uint *)((long)pcVar45 + uVar36)),0x10);
    auVar17._4_4_ = center.m_floats[1];
    auVar17._0_4_ = center.m_floats[1];
    auVar17._8_4_ = center.m_floats[1];
    auVar17._12_4_ = center.m_floats[1];
    auVar80 = vmulps_avx512vl(auVar80,auVar17);
    auVar18._4_4_ = center.m_floats[0];
    auVar18._0_4_ = center.m_floats[0];
    auVar18._8_4_ = center.m_floats[0];
    auVar18._12_4_ = center.m_floats[0];
    auVar83 = vfmadd132ps_avx512vl(auVar83,auVar80,auVar18);
    auVar80 = vinsertps_avx(ZEXT416(*(uint *)((long)pcVar45 + uVar40 + 0x20)),
                            ZEXT416(*(uint *)((long)pcVar45 + uVar36 + 0x20)),0x10);
    pcVar49 = (cbtScalar *)((long)local_248 + (ulong)(local_2b8 * 4));
    auVar19._4_4_ = center.m_floats[2];
    auVar19._0_4_ = center.m_floats[2];
    auVar19._8_4_ = center.m_floats[2];
    auVar19._12_4_ = center.m_floats[2];
    auVar83 = vfmadd132ps_avx512vl(auVar80,auVar83,auVar19);
    local_1e8._0_4_ = dDOT44((cbtScalar *)((long)pcVar45 + uVar40),pcVar49);
    local_1e8._4_4_ = extraout_XMM0_Db_07;
    local_1e8._8_4_ = extraout_XMM0_Dc_07;
    local_1e8._12_4_ = extraout_XMM0_Dd_07;
    uVar39 = (ulong)((bVar5 + 1) * 4);
    pcVar35 = (cbtScalar *)((long)local_248 + uVar39);
    cVar85 = dDOT44((cbtScalar *)((long)pcVar45 + uVar40),pcVar35);
    cVar86 = dDOT44((cbtScalar *)((long)pcVar45 + uVar36),pcVar49);
    auVar102._0_4_ = dDOT44((cbtScalar *)((long)pcVar45 + uVar36),pcVar35);
    auVar102._4_60_ = extraout_var_02;
    local_188 = auVar102._0_16_;
    pcVar45 = ua.m_floats;
    lVar33 = 0;
    auVar80 = vinsertps_avx(local_1e8,ZEXT416((uint)cVar86),0x10);
    uVar127 = *(undefined4 *)((long)puVar1 + (ulong)(local_2b8 * 4));
    auVar20._4_4_ = uVar127;
    auVar20._0_4_ = uVar127;
    auVar20._8_4_ = uVar127;
    auVar20._12_4_ = uVar127;
    auVar60 = vmulps_avx512vl(auVar80,auVar20);
    auVar29._4_4_ = extraout_XMM0_Db_08;
    auVar29._0_4_ = cVar85;
    auVar29._8_4_ = extraout_XMM0_Dc_08;
    auVar29._12_4_ = extraout_XMM0_Dd_08;
    auVar80 = vinsertps_avx(auVar29,local_188,0x10);
    uVar127 = *(undefined4 *)((long)puVar1 + uVar39);
    auVar21._4_4_ = uVar127;
    auVar21._0_4_ = uVar127;
    auVar21._8_4_ = uVar127;
    auVar21._12_4_ = uVar127;
    auVar82 = vmulps_avx512vl(auVar80,auVar21);
    auVar80 = vsubps_avx(auVar83,auVar60);
    fVar91 = auVar83._0_4_ + auVar60._0_4_;
    fVar108 = auVar83._4_4_ + auVar60._4_4_;
    auVar112._0_8_ = auVar82._0_8_;
    auVar112._8_8_ = auVar112._0_8_;
    auVar112._16_8_ = auVar112._0_8_;
    auVar112._24_8_ = auVar112._0_8_;
    auVar96._8_8_ = auVar80._0_8_;
    auVar96._0_8_ = auVar80._0_8_;
    auVar96._16_8_ = CONCAT44(fVar108,fVar91);
    auVar96._24_8_ = CONCAT44(fVar108,fVar91);
    auVar96 = vsubps_avx(auVar96,auVar112);
    fVar124 = auVar82._0_4_;
    auVar97._0_4_ = auVar80._0_4_ + fVar124;
    fVar92 = auVar82._4_4_;
    auVar97._4_4_ = auVar80._4_4_ + fVar92;
    auVar97._8_4_ = auVar80._0_4_ + fVar124;
    auVar97._12_4_ = auVar80._4_4_ + fVar92;
    auVar97._16_4_ = fVar91 + fVar124;
    auVar97._20_4_ = fVar108 + fVar92;
    auVar97._24_4_ = fVar91 + fVar124;
    auVar97._28_4_ = fVar108 + fVar92;
    _ua = vblendps_avx(auVar96,auVar97,0x3c);
    local_2e8 = ret;
    rect[0] = *(cbtScalar *)((long)puVar2 + uVar40);
    rect[1] = *(cbtScalar *)((long)puVar2 + uVar36);
    pcVar49 = point;
    lVar32 = 4;
    uVar42 = 0;
    for (lVar46 = 0; pcVar35 = pcVar45, lVar46 != 2; lVar46 = lVar46 + 1) {
      uVar39 = (ulong)(uint)((1 - (int)lVar46) * 4);
      for (iVar48 = -1; iVar48 < 2; iVar48 = iVar48 + 2) {
        auVar95._0_4_ = (float)iVar48;
        auVar95._4_12_ = auVar114._4_12_;
        lVar51 = 0;
        uVar42 = 0;
        lVar41 = lVar32;
        pcVar47 = local_2e8;
        lVar52 = lVar33;
        for (; 0 < (int)uVar43; uVar43 = uVar43 - 1) {
          fVar124 = *(float *)((long)pcVar45 + lVar52);
          fVar92 = rect[lVar46];
          fVar91 = fVar124 * auVar95._0_4_;
          pcVar35 = local_2e8;
          if (fVar91 < fVar92) {
            uVar42 = uVar42 + 1;
            *pcVar47 = *(cbtScalar *)((long)pcVar45 + lVar51);
            pcVar47[1] = *(cbtScalar *)((long)pcVar45 + lVar51 + 4);
            if ((uVar42 & 8) != 0) goto LAB_00df3e0e;
            fVar124 = *(float *)((long)pcVar45 + lVar52);
            fVar92 = rect[lVar46];
            pcVar47 = pcVar47 + 2;
            fVar91 = fVar124 * auVar95._0_4_;
          }
          pcVar38 = (cbtScalar *)((long)pcVar45 + lVar51 + 8);
          if (uVar43 == 1) {
            pcVar38 = pcVar45;
          }
          if (fVar91 < fVar92 != pcVar38[lVar46] * auVar95._0_4_ < fVar92) {
            auVar80 = vfmsub213ss_fma(ZEXT416((uint)fVar92),auVar95,ZEXT416((uint)fVar124));
            fVar92 = rect[lVar46];
            uVar42 = uVar42 + 1;
            auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)((*(float *)((long)pcVar38 + uVar39) -
                                                             *(float *)((long)pcVar45 + lVar41)) /
                                                            (pcVar38[lVar46] - fVar124))),
                                      ZEXT416((uint)*(float *)((long)pcVar45 + lVar41)));
            *(int *)((long)pcVar47 + uVar39) = auVar80._0_4_;
            pcVar47[lVar46] = auVar95._0_4_ * fVar92;
            if ((uVar42 & 8) != 0) goto LAB_00df3e0e;
            pcVar47 = pcVar47 + 2;
          }
          auVar114 = ZEXT464(0);
          lVar51 = lVar51 + 8;
          lVar41 = lVar41 + 8;
          lVar52 = lVar52 + 8;
        }
        pcVar35 = ret;
        if (local_2e8 == ret) {
          pcVar35 = pcVar49;
        }
        pcVar45 = local_2e8;
        uVar43 = uVar42;
        local_2e8 = pcVar35;
      }
      lVar32 = lVar32 + -4;
      lVar33 = lVar33 + 4;
    }
LAB_00df3e0e:
    if ((cbtVector3 *)pcVar35 != (cbtVector3 *)ret) {
      memcpy(ret,pcVar35,(long)(int)(uVar42 * 2) << 2);
    }
    if (0 < (int)uVar42) {
      local_2e8 = (cbtScalar *)0x0;
      auVar80 = vfmsub231ss_fma(ZEXT416((uint)(cVar86 * cVar85)),local_1e8,local_188);
      fVar91 = 1.0 / auVar80._0_4_;
      auVar114 = ZEXT464((uint)((float)local_1e8._0_4_ * fVar91));
      fVar92 = local_188._0_4_ * fVar91;
      auVar116 = ZEXT464((uint)fVar92);
      fVar124 = *(float *)((long)puVar2 + (ulong)uVar37 * 4);
      auVar80 = vmovshdup_avx(auVar83);
      for (uVar39 = 0; uVar37 = (uint)local_2e8, uVar39 != uVar42; uVar39 = uVar39 + 1) {
        auVar128._8_8_ = 0;
        auVar128._0_8_ = *(ulong *)(ret + uVar39 * 2);
        lVar33 = 0;
        lVar32 = (long)(int)(uVar37 * 3);
        auVar60 = vmovshdup_avx(auVar128);
        fVar108 = auVar60._0_4_ - auVar80._0_4_;
        auVar82 = ZEXT416((uint)((float)*(ulong *)(ret + uVar39 * 2) - auVar83._0_4_));
        auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar91 * -cVar85)),ZEXT416((uint)fVar92),
                                  auVar82);
        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * (float)local_1e8._0_4_ * fVar91)),
                                  ZEXT416((uint)(fVar91 * -cVar86)),auVar82);
        for (; lVar33 != 0xc; lVar33 = lVar33 + 4) {
          auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_248[(ulong)local_2b8 + lVar33]),auVar60,
                                    ZEXT416(*(uint *)((long)center.m_floats + lVar33)));
          auVar81 = vfmadd231ss_fma(auVar81,auVar82,
                                    ZEXT416((uint)local_248[(ulong)(bVar5 + 1) + lVar33]));
          *(int *)((long)point + lVar33 + lVar32 * 4) = auVar81._0_4_;
        }
        auVar60 = vfmadd231ss_fma(ZEXT416((uint)(local_178 * point[lVar32 + 1])),local_1b8,
                                  ZEXT416((uint)point[lVar32]));
        auVar60 = vfmadd231ss_fma(auVar60,auVar79,ZEXT416((uint)point[lVar32 + 2]));
        fVar108 = fVar124 - auVar60._0_4_;
        dep[(int)uVar37] = fVar108;
        if (0.0 <= fVar108) {
          local_2e8 = (cbtScalar *)(ulong)(uVar37 + 1);
          uVar4 = vmovlps_avx(auVar128);
          *(undefined8 *)(ret + (int)(uVar37 * 2)) = uVar4;
        }
      }
      if (0 < (int)uVar37) {
        if ((int)uVar37 < maxc) {
          maxc = uVar37;
        }
        uVar39 = 1;
        if (1 < maxc) {
          uVar39 = (ulong)(uint)maxc;
        }
        if ((uint)uVar39 < uVar37) {
          auVar114 = ZEXT464((uint)dep[0]);
          uVar40 = 0;
          for (uVar36 = 1; local_2e8 != (cbtScalar *)uVar36; uVar36 = uVar36 + 1) {
            fVar124 = dep[uVar36];
            auVar116 = ZEXT464((uint)fVar124);
            fVar92 = auVar114._0_4_;
            auVar80 = vmaxss_avx(ZEXT416((uint)fVar124),auVar114._0_16_);
            auVar114 = ZEXT1664(auVar80);
            if (fVar92 < fVar124) {
              uVar40 = uVar36 & 0xffffffff;
            }
          }
          auVar114 = ZEXT1664(auVar114._0_16_);
          auVar118 = ZEXT1664(auVar116._0_16_);
          cullPoints2(uVar37,ret,(uint)uVar39,(int)uVar40,iret);
          for (uVar36 = 0; auVar109 = auVar118._8_56_, local_2e8 = (cbtScalar *)uVar39,
              uVar36 != uVar39; uVar36 = uVar36 + 1) {
            iVar48 = iret[uVar36];
            for (lVar32 = 0; auVar120 = auVar114._8_56_, lVar32 != 3; lVar32 = lVar32 + 1) {
              fVar124 = point[iVar48 * 3 + lVar32] + local_2d0->m_floats[lVar32];
              auVar114 = ZEXT464((uint)fVar124);
              posInWorld.m_floats[lVar32] = fVar124;
            }
            if (uVar44 < 4) {
              cVar134 = operator-(normal);
              auVar118._0_8_ = cVar134.m_floats._8_8_;
              auVar118._8_56_ = auVar109;
              auVar104._0_8_ = cVar134.m_floats._0_8_;
              auVar104._8_56_ = auVar120;
              local_d8 = vmovlhps_avx(auVar104._0_16_,auVar118._0_16_);
              cVar85 = dep[iVar48];
              pcVar34 = &posInWorld;
            }
            else {
              cVar134 = operator-(normal);
              auVar117._0_8_ = cVar134.m_floats._8_8_;
              auVar117._8_56_ = auVar109;
              auVar105._0_8_ = cVar134.m_floats._0_8_;
              auVar105._8_56_ = auVar120;
              local_d8 = vmovlhps_avx(auVar105._0_16_,auVar117._0_16_);
              auVar109 = ZEXT856(local_d8._8_8_);
              cVar135 = operator*(normal,dep + iVar48);
              cVar134 = posInWorld;
              auVar106._0_8_ = cVar135.m_floats._0_8_;
              auVar106._8_56_ = auVar109;
              auVar123._8_8_ = 0;
              auVar123._0_4_ = posInWorld.m_floats[0];
              auVar123._4_4_ = posInWorld.m_floats[1];
              posInWorld.m_floats[2] = cVar134.m_floats[2];
              auVar80 = vsubps_avx(auVar123,auVar106._0_16_);
              fVar124 = posInWorld.m_floats[2] - cVar135.m_floats[2];
              auVar118 = ZEXT464((uint)fVar124);
              acVar3 = (cbtScalar  [4])vinsertps_avx(auVar80,ZEXT416((uint)fVar124),0x28);
              local_40.m_floats[0] = acVar3[0];
              local_40.m_floats[1] = acVar3[1];
              local_40.m_floats[2] = acVar3[2];
              local_40.m_floats[3] = acVar3[3];
              cVar85 = dep[iVar48];
              pcVar34 = &local_40;
              posInWorld = cVar134;
            }
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(ZEXT416((uint)cVar85),auVar22);
            auVar114 = ZEXT1664(auVar80);
            (*output->_vptr_Result[4])(auVar80._0_8_,output,local_d8,pcVar34);
          }
        }
        else if (uVar44 < 4) {
          pcVar45 = point;
          for (uVar39 = 0; (cbtScalar *)uVar39 != local_2e8; uVar39 = uVar39 + 1) {
            for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
              fVar124 = pcVar45[lVar32] + local_2d0->m_floats[lVar32];
              auVar114 = ZEXT464((uint)fVar124);
              iret[lVar32] = (int)fVar124;
            }
            auVar109 = ZEXT856(auVar114._8_8_);
            auVar120 = ZEXT856(auVar116._8_8_);
            cVar134 = operator-(normal);
            auVar116._0_8_ = cVar134.m_floats._8_8_;
            auVar116._8_56_ = auVar120;
            auVar103._0_8_ = cVar134.m_floats._0_8_;
            auVar103._8_56_ = auVar109;
            posInWorld.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar103._0_16_,auVar116._0_16_);
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(ZEXT416((uint)dep[uVar39]),auVar23);
            auVar114 = ZEXT1664(auVar80);
            (*output->_vptr_Result[4])(auVar80._0_8_,output,&posInWorld,iret);
            pcVar45 = pcVar45 + 3;
          }
        }
        else {
          for (uVar39 = 0; (cbtScalar *)uVar39 != local_2e8; uVar39 = uVar39 + 1) {
            cVar85 = dep[uVar39];
            for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
              auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(pcVar49[lVar32] +
                                                       local_2d0->m_floats[lVar32])),
                                         ZEXT416((uint)cVar85),
                                         ZEXT416((uint)normal->m_floats[lVar32]));
              auVar114 = ZEXT1664(auVar80);
              iret[lVar32] = auVar80._0_4_;
            }
            auVar109 = ZEXT856(auVar114._8_8_);
            auVar120 = ZEXT856(0);
            cVar134 = operator-(normal);
            auVar119._0_8_ = cVar134.m_floats._8_8_;
            auVar119._8_56_ = auVar120;
            auVar107._0_8_ = cVar134.m_floats._0_8_;
            auVar107._8_56_ = auVar109;
            posInWorld.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar107._0_16_,auVar119._0_16_);
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(ZEXT416((uint)cVar85),auVar24);
            auVar114 = ZEXT1664(auVar80);
            (*output->_vptr_Result[4])(auVar80._0_8_,output,&posInWorld,iret);
            pcVar49 = pcVar49 + 3;
          }
        }
        *return_code = uVar44;
        return (int)local_2e8;
      }
    }
    local_2e8._0_4_ = 0;
  }
  else {
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      point[lVar32] = p1->m_floats[lVar32];
    }
    pcVar45 = R1;
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      auVar99._0_4_ = dDOT14(normal->m_floats,R1 + lVar32);
      auVar99._4_60_ = extraout_var_00;
      uVar37 = *(uint *)((long)&local_198 + lVar32 * 4);
      uVar4 = vcmpss_avx512f(auVar99._0_16_,ZEXT416(0),0xe);
      bVar5 = (bool)((byte)uVar4 & 1);
      lVar33 = 0;
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar80 = vxorps_avx512vl(ZEXT416(uVar37),auVar14);
      auVar84._4_12_ = auVar80._4_12_;
      auVar84._0_4_ = bVar5 * uVar37 + (uint)!bVar5 * auVar80._0_4_;
      auVar114 = ZEXT1664(auVar84);
      for (; lVar33 != 0xc; lVar33 = lVar33 + 4) {
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)pcVar45[lVar33]),auVar84,
                                  ZEXT416(*(uint *)((long)point + lVar33)));
        *(int *)((long)point + lVar33) = auVar80._0_4_;
      }
      pcVar45 = pcVar45 + 1;
    }
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      ret[lVar32] = p2->m_floats[lVar32];
    }
    pcVar45 = R2;
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      auVar100._0_4_ = dDOT14(normal->m_floats,R2 + lVar32);
      auVar100._4_60_ = extraout_var_01;
      uVar37 = *(uint *)((long)&local_1a8 + lVar32 * 4);
      uVar4 = vcmpss_avx512f(auVar100._0_16_,ZEXT416(0),0xe);
      bVar5 = (bool)((byte)uVar4 & 1);
      lVar33 = 0;
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar80 = vxorps_avx512vl(ZEXT416(uVar37),auVar15);
      auVar80 = ZEXT416((uint)bVar5 * auVar80._0_4_ + !bVar5 * uVar37);
      auVar114 = ZEXT1664(auVar80);
      for (; lVar33 != 0xc; lVar33 = lVar33 + 4) {
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)pcVar45[lVar33]),auVar80,
                                  ZEXT416(*(uint *)((long)ret + lVar33)));
        *(int *)((long)ret + lVar33) = auVar83._0_4_;
      }
      pcVar45 = pcVar45 + 1;
    }
    for (lVar32 = 0; lVar32 != 0xc; lVar32 = lVar32 + 4) {
      *(cbtScalar *)((long)ua.m_floats + lVar32) = R1[(ulong)(uVar44 - 7) / 3 + lVar32];
    }
    for (lVar32 = 0; lVar32 != 0xc; lVar32 = lVar32 + 4) {
      *(cbtScalar *)((long)dep + lVar32) = R2[(ulong)(uVar44 - 7) % 3 + lVar32];
    }
    dLineClosestApproach
              ((cbtVector3 *)point,&ua,(cbtVector3 *)ret,(cbtVector3 *)dep,nr.m_floats,
               center.m_floats);
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      auVar80 = vfmadd213ss_fma(ZEXT416((uint)ua.m_floats[lVar32]),ZEXT416((uint)nr.m_floats[0]),
                                ZEXT416((uint)point[lVar32]));
      auVar114 = ZEXT1664(auVar80);
      point[lVar32] = auVar80._0_4_;
    }
    auVar109 = (undefined1  [56])0x0;
    for (lVar32 = 0; auVar120 = auVar114._8_56_, lVar32 != 3; lVar32 = lVar32 + 1) {
      auVar80 = vfmadd213ss_fma(ZEXT416((uint)dep[lVar32]),ZEXT416((uint)center.m_floats[0]),
                                ZEXT416((uint)ret[lVar32]));
      auVar114 = ZEXT1664(auVar80);
      ret[lVar32] = auVar80._0_4_;
    }
    cVar134 = operator-(normal);
    auVar115._0_8_ = cVar134.m_floats._8_8_;
    auVar115._8_56_ = auVar120;
    auVar101._0_8_ = cVar134.m_floats._0_8_;
    auVar101._8_56_ = auVar109;
    iret._0_16_ = vmovlhps_avx(auVar101._0_16_,auVar115._0_16_);
    auVar16._8_4_ = 0x80000000;
    auVar16._0_8_ = 0x8000000080000000;
    auVar16._12_4_ = 0x80000000;
    auVar80 = vxorps_avx512vl(ZEXT416((uint)*depth),auVar16);
    (*output->_vptr_Result[4])(auVar80._0_8_,output,iret,ret);
    *return_code = uVar44;
    local_2e8._0_4_ = 1;
  }
  return (int)local_2e8;
}

Assistant:

int dBoxBox2(const cbtVector3& p1, const dMatrix3 R1,
			 const cbtVector3& side1, const cbtVector3& p2,
			 const dMatrix3 R2, const cbtVector3& side2,
			 cbtVector3& normal, cbtScalar* depth, int* return_code,
			 int maxc, dContactGeom* /*contact*/, int /*skip*/, cbtDiscreteCollisionDetectorInterface::Result& output)
{
	const cbtScalar fudge_factor = cbtScalar(1.05);
	cbtVector3 p, pp, normalC(0.f, 0.f, 0.f);
	const cbtScalar* normalR = 0;
	cbtScalar A[3], B[3], R11, R12, R13, R21, R22, R23, R31, R32, R33,
		Q11, Q12, Q13, Q21, Q22, Q23, Q31, Q32, Q33, s, s2, l;
	int i, j, invert_normal, code;

	// get vector from centers of box 1 to box 2, relative to box 1
	p = p2 - p1;
	dMULTIPLY1_331(pp, R1, p);  // get pp = p relative to body 1

	// get side lengths / 2
	A[0] = side1[0] * cbtScalar(0.5);
	A[1] = side1[1] * cbtScalar(0.5);
	A[2] = side1[2] * cbtScalar(0.5);
	B[0] = side2[0] * cbtScalar(0.5);
	B[1] = side2[1] * cbtScalar(0.5);
	B[2] = side2[2] * cbtScalar(0.5);

	// Rij is R1'*R2, i.e. the relative rotation between R1 and R2
	R11 = dDOT44(R1 + 0, R2 + 0);
	R12 = dDOT44(R1 + 0, R2 + 1);
	R13 = dDOT44(R1 + 0, R2 + 2);
	R21 = dDOT44(R1 + 1, R2 + 0);
	R22 = dDOT44(R1 + 1, R2 + 1);
	R23 = dDOT44(R1 + 1, R2 + 2);
	R31 = dDOT44(R1 + 2, R2 + 0);
	R32 = dDOT44(R1 + 2, R2 + 1);
	R33 = dDOT44(R1 + 2, R2 + 2);

	Q11 = cbtFabs(R11);
	Q12 = cbtFabs(R12);
	Q13 = cbtFabs(R13);
	Q21 = cbtFabs(R21);
	Q22 = cbtFabs(R22);
	Q23 = cbtFabs(R23);
	Q31 = cbtFabs(R31);
	Q32 = cbtFabs(R32);
	Q33 = cbtFabs(R33);

	// for all 15 possible separating axes:
	//   * see if the axis separates the boxes. if so, return 0.
	//   * find the depth of the penetration along the separating axis (s2)
	//   * if this is the largest depth so far, record it.
	// the normal vector will be set to the separating axis with the smallest
	// depth. note: normalR is set to point to a column of R1 or R2 if that is
	// the smallest depth normal so far. otherwise normalR is 0 and normalC is
	// set to a vector relative to body 1. invert_normal is 1 if the sign of
	// the normal should be flipped.

#define TST(expr1, expr2, norm, cc)    \
	s2 = cbtFabs(expr1) - (expr2);      \
	if (s2 > 0) return 0;              \
	if (s2 > s)                        \
	{                                  \
		s = s2;                        \
		normalR = norm;                \
		invert_normal = ((expr1) < 0); \
		code = (cc);                   \
	}

	s = -dInfinity;
	invert_normal = 0;
	code = 0;

	// separating axis = u1,u2,u3
	TST(pp[0], (A[0] + B[0] * Q11 + B[1] * Q12 + B[2] * Q13), R1 + 0, 1);
	TST(pp[1], (A[1] + B[0] * Q21 + B[1] * Q22 + B[2] * Q23), R1 + 1, 2);
	TST(pp[2], (A[2] + B[0] * Q31 + B[1] * Q32 + B[2] * Q33), R1 + 2, 3);

	// separating axis = v1,v2,v3
	TST(dDOT41(R2 + 0, p), (A[0] * Q11 + A[1] * Q21 + A[2] * Q31 + B[0]), R2 + 0, 4);
	TST(dDOT41(R2 + 1, p), (A[0] * Q12 + A[1] * Q22 + A[2] * Q32 + B[1]), R2 + 1, 5);
	TST(dDOT41(R2 + 2, p), (A[0] * Q13 + A[1] * Q23 + A[2] * Q33 + B[2]), R2 + 2, 6);

	// note: cross product axes need to be scaled when s is computed.
	// normal (n1,n2,n3) is relative to box 1.
#undef TST
#define TST(expr1, expr2, n1, n2, n3, cc)                \
	s2 = cbtFabs(expr1) - (expr2);                        \
	if (s2 > SIMD_EPSILON) return 0;                     \
	l = cbtSqrt((n1) * (n1) + (n2) * (n2) + (n3) * (n3)); \
	if (l > SIMD_EPSILON)                                \
	{                                                    \
		s2 /= l;                                         \
		if (s2 * fudge_factor > s)                       \
		{                                                \
			s = s2;                                      \
			normalR = 0;                                 \
			normalC[0] = (n1) / l;                       \
			normalC[1] = (n2) / l;                       \
			normalC[2] = (n3) / l;                       \
			invert_normal = ((expr1) < 0);               \
			code = (cc);                                 \
		}                                                \
	}

	cbtScalar fudge2(1.0e-5f);

	Q11 += fudge2;
	Q12 += fudge2;
	Q13 += fudge2;

	Q21 += fudge2;
	Q22 += fudge2;
	Q23 += fudge2;

	Q31 += fudge2;
	Q32 += fudge2;
	Q33 += fudge2;

	// separating axis = u1 x (v1,v2,v3)
	TST(pp[2] * R21 - pp[1] * R31, (A[1] * Q31 + A[2] * Q21 + B[1] * Q13 + B[2] * Q12), 0, -R31, R21, 7);
	TST(pp[2] * R22 - pp[1] * R32, (A[1] * Q32 + A[2] * Q22 + B[0] * Q13 + B[2] * Q11), 0, -R32, R22, 8);
	TST(pp[2] * R23 - pp[1] * R33, (A[1] * Q33 + A[2] * Q23 + B[0] * Q12 + B[1] * Q11), 0, -R33, R23, 9);

	// separating axis = u2 x (v1,v2,v3)
	TST(pp[0] * R31 - pp[2] * R11, (A[0] * Q31 + A[2] * Q11 + B[1] * Q23 + B[2] * Q22), R31, 0, -R11, 10);
	TST(pp[0] * R32 - pp[2] * R12, (A[0] * Q32 + A[2] * Q12 + B[0] * Q23 + B[2] * Q21), R32, 0, -R12, 11);
	TST(pp[0] * R33 - pp[2] * R13, (A[0] * Q33 + A[2] * Q13 + B[0] * Q22 + B[1] * Q21), R33, 0, -R13, 12);

	// separating axis = u3 x (v1,v2,v3)
	TST(pp[1] * R11 - pp[0] * R21, (A[0] * Q21 + A[1] * Q11 + B[1] * Q33 + B[2] * Q32), -R21, R11, 0, 13);
	TST(pp[1] * R12 - pp[0] * R22, (A[0] * Q22 + A[1] * Q12 + B[0] * Q33 + B[2] * Q31), -R22, R12, 0, 14);
	TST(pp[1] * R13 - pp[0] * R23, (A[0] * Q23 + A[1] * Q13 + B[0] * Q32 + B[1] * Q31), -R23, R13, 0, 15);

#undef TST

	if (!code) return 0;

	// if we get to this point, the boxes interpenetrate. compute the normal
	// in global coordinates.
	if (normalR)
	{
		normal[0] = normalR[0];
		normal[1] = normalR[4];
		normal[2] = normalR[8];
	}
	else
	{
		dMULTIPLY0_331(normal, R1, normalC);
	}
	if (invert_normal)
	{
		normal[0] = -normal[0];
		normal[1] = -normal[1];
		normal[2] = -normal[2];
	}
	*depth = -s;

	// compute contact point(s)

	if (code > 6)
	{
		// an edge from box 1 touches an edge from box 2.
		// find a point pa on the intersecting edge of box 1
		cbtVector3 pa;
		cbtScalar sign;
		for (i = 0; i < 3; i++) pa[i] = p1[i];
		for (j = 0; j < 3; j++)
		{
			sign = (dDOT14(normal, R1 + j) > 0) ? cbtScalar(1.0) : cbtScalar(-1.0);
			for (i = 0; i < 3; i++) pa[i] += sign * A[j] * R1[i * 4 + j];
		}

		// find a point pb on the intersecting edge of box 2
		cbtVector3 pb;
		for (i = 0; i < 3; i++) pb[i] = p2[i];
		for (j = 0; j < 3; j++)
		{
			sign = (dDOT14(normal, R2 + j) > 0) ? cbtScalar(-1.0) : cbtScalar(1.0);
			for (i = 0; i < 3; i++) pb[i] += sign * B[j] * R2[i * 4 + j];
		}

		cbtScalar alpha, beta;
		cbtVector3 ua, ub;
		for (i = 0; i < 3; i++) ua[i] = R1[((code)-7) / 3 + i * 4];
		for (i = 0; i < 3; i++) ub[i] = R2[((code)-7) % 3 + i * 4];

		dLineClosestApproach(pa, ua, pb, ub, &alpha, &beta);
		for (i = 0; i < 3; i++) pa[i] += ua[i] * alpha;
		for (i = 0; i < 3; i++) pb[i] += ub[i] * beta;

		{
			//contact[0].pos[i] = cbtScalar(0.5)*(pa[i]+pb[i]);
			//contact[0].depth = *depth;
			cbtVector3 pointInWorld;

#ifdef USE_CENTER_POINT
			for (i = 0; i < 3; i++)
				pointInWorld[i] = (pa[i] + pb[i]) * cbtScalar(0.5);
			output.addContactPoint(-normal, pointInWorld, -*depth);
#else
			output.addContactPoint(-normal, pb, -*depth);

#endif  //
			*return_code = code;
		}
		return 1;
	}

	// okay, we have a face-something intersection (because the separating
	// axis is perpendicular to a face). define face 'a' to be the reference
	// face (i.e. the normal vector is perpendicular to this) and face 'b' to be
	// the incident face (the closest face of the other box).

	const cbtScalar *Ra, *Rb, *pa, *pb, *Sa, *Sb;
	if (code <= 3)
	{
		Ra = R1;
		Rb = R2;
		pa = p1;
		pb = p2;
		Sa = A;
		Sb = B;
	}
	else
	{
		Ra = R2;
		Rb = R1;
		pa = p2;
		pb = p1;
		Sa = B;
		Sb = A;
	}

	// nr = normal vector of reference face dotted with axes of incident box.
	// anr = absolute values of nr.
	cbtVector3 normal2, nr, anr;
	if (code <= 3)
	{
		normal2[0] = normal[0];
		normal2[1] = normal[1];
		normal2[2] = normal[2];
	}
	else
	{
		normal2[0] = -normal[0];
		normal2[1] = -normal[1];
		normal2[2] = -normal[2];
	}
	dMULTIPLY1_331(nr, Rb, normal2);
	anr[0] = cbtFabs(nr[0]);
	anr[1] = cbtFabs(nr[1]);
	anr[2] = cbtFabs(nr[2]);

	// find the largest compontent of anr: this corresponds to the normal
	// for the indident face. the other axis numbers of the indicent face
	// are stored in a1,a2.
	int lanr, a1, a2;
	if (anr[1] > anr[0])
	{
		if (anr[1] > anr[2])
		{
			a1 = 0;
			lanr = 1;
			a2 = 2;
		}
		else
		{
			a1 = 0;
			a2 = 1;
			lanr = 2;
		}
	}
	else
	{
		if (anr[0] > anr[2])
		{
			lanr = 0;
			a1 = 1;
			a2 = 2;
		}
		else
		{
			a1 = 0;
			a2 = 1;
			lanr = 2;
		}
	}

	// compute center point of incident face, in reference-face coordinates
	cbtVector3 center;
	if (nr[lanr] < 0)
	{
		for (i = 0; i < 3; i++) center[i] = pb[i] - pa[i] + Sb[lanr] * Rb[i * 4 + lanr];
	}
	else
	{
		for (i = 0; i < 3; i++) center[i] = pb[i] - pa[i] - Sb[lanr] * Rb[i * 4 + lanr];
	}

	// find the normal and non-normal axis numbers of the reference box
	int codeN, code1, code2;
	if (code <= 3)
		codeN = code - 1;
	else
		codeN = code - 4;
	if (codeN == 0)
	{
		code1 = 1;
		code2 = 2;
	}
	else if (codeN == 1)
	{
		code1 = 0;
		code2 = 2;
	}
	else
	{
		code1 = 0;
		code2 = 1;
	}

	// find the four corners of the incident face, in reference-face coordinates
	cbtScalar quad[8];  // 2D coordinate of incident face (x,y pairs)
	cbtScalar c1, c2, m11, m12, m21, m22;
	c1 = dDOT14(center, Ra + code1);
	c2 = dDOT14(center, Ra + code2);
	// optimize this? - we have already computed this data above, but it is not
	// stored in an easy-to-index format. for now it's quicker just to recompute
	// the four dot products.
	m11 = dDOT44(Ra + code1, Rb + a1);
	m12 = dDOT44(Ra + code1, Rb + a2);
	m21 = dDOT44(Ra + code2, Rb + a1);
	m22 = dDOT44(Ra + code2, Rb + a2);
	{
		cbtScalar k1 = m11 * Sb[a1];
		cbtScalar k2 = m21 * Sb[a1];
		cbtScalar k3 = m12 * Sb[a2];
		cbtScalar k4 = m22 * Sb[a2];
		quad[0] = c1 - k1 - k3;
		quad[1] = c2 - k2 - k4;
		quad[2] = c1 - k1 + k3;
		quad[3] = c2 - k2 + k4;
		quad[4] = c1 + k1 + k3;
		quad[5] = c2 + k2 + k4;
		quad[6] = c1 + k1 - k3;
		quad[7] = c2 + k2 - k4;
	}

	// find the size of the reference face
	cbtScalar rect[2];
	rect[0] = Sa[code1];
	rect[1] = Sa[code2];

	// intersect the incident and reference faces
	cbtScalar ret[16];
	int n = intersectRectQuad2(rect, quad, ret);
	if (n < 1) return 0;  // this should never happen

	// convert the intersection points into reference-face coordinates,
	// and compute the contact position and depth for each point. only keep
	// those points that have a positive (penetrating) depth. delete points in
	// the 'ret' array as necessary so that 'point' and 'ret' correspond.
	cbtScalar point[3 * 8];  // penetrating contact points
	cbtScalar dep[8];        // depths for those points
	cbtScalar det1 = 1.f / (m11 * m22 - m12 * m21);
	m11 *= det1;
	m12 *= det1;
	m21 *= det1;
	m22 *= det1;
	int cnum = 0;  // number of penetrating contact points found
	for (j = 0; j < n; j++)
	{
		cbtScalar k1 = m22 * (ret[j * 2] - c1) - m12 * (ret[j * 2 + 1] - c2);
		cbtScalar k2 = -m21 * (ret[j * 2] - c1) + m11 * (ret[j * 2 + 1] - c2);
		for (i = 0; i < 3; i++) point[cnum * 3 + i] =
									center[i] + k1 * Rb[i * 4 + a1] + k2 * Rb[i * 4 + a2];
		dep[cnum] = Sa[codeN] - dDOT(normal2, point + cnum * 3);
		if (dep[cnum] >= 0)
		{
			ret[cnum * 2] = ret[j * 2];
			ret[cnum * 2 + 1] = ret[j * 2 + 1];
			cnum++;
		}
	}
	if (cnum < 1) return 0;  // this should never happen

	// we can't generate more contacts than we actually have
	if (maxc > cnum) maxc = cnum;
	if (maxc < 1) maxc = 1;

	if (cnum <= maxc)
	{
		if (code < 4)
		{
			// we have less contacts than we need, so we use them all
			for (j = 0; j < cnum; j++)
			{
				cbtVector3 pointInWorld;
				for (i = 0; i < 3; i++)
					pointInWorld[i] = point[j * 3 + i] + pa[i];
				output.addContactPoint(-normal, pointInWorld, -dep[j]);
			}
		}
		else
		{
			// we have less contacts than we need, so we use them all
			for (j = 0; j < cnum; j++)
			{
				cbtVector3 pointInWorld;
				for (i = 0; i < 3; i++)
					pointInWorld[i] = point[j * 3 + i] + pa[i] - normal[i] * dep[j];
				//pointInWorld[i] = point[j*3+i] + pa[i];
				output.addContactPoint(-normal, pointInWorld, -dep[j]);
			}
		}
	}
	else
	{
		// we have more contacts than are wanted, some of them must be culled.
		// find the deepest point, it is always the first contact.
		int i1 = 0;
		cbtScalar maxdepth = dep[0];
		for (i = 1; i < cnum; i++)
		{
			if (dep[i] > maxdepth)
			{
				maxdepth = dep[i];
				i1 = i;
			}
		}

		int iret[8];
		cullPoints2(cnum, ret, maxc, i1, iret);

		for (j = 0; j < maxc; j++)
		{
			//      dContactGeom *con = CONTACT(contact,skip*j);
			//    for (i=0; i<3; i++) con->pos[i] = point[iret[j]*3+i] + pa[i];
			//  con->depth = dep[iret[j]];

			cbtVector3 posInWorld;
			for (i = 0; i < 3; i++)
				posInWorld[i] = point[iret[j] * 3 + i] + pa[i];
			if (code < 4)
			{
				output.addContactPoint(-normal, posInWorld, -dep[iret[j]]);
			}
			else
			{
				output.addContactPoint(-normal, posInWorld - normal * dep[iret[j]], -dep[iret[j]]);
			}
		}
		cnum = maxc;
	}

	*return_code = code;
	return cnum;
}